

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_zip.c
# Opt level: O0

zip_source_t *
zip_source_zip_create
          (zip_t *srcza,zip_uint64_t srcidx,zip_flags_t flags,zip_uint64_t start,zip_int64_t len,
          zip_error_t *error)

{
  zip_error_t *error_local;
  zip_int64_t len_local;
  zip_uint64_t start_local;
  zip_flags_t flags_local;
  zip_uint64_t srcidx_local;
  zip_t *srcza_local;
  
  if (len < -1) {
    zip_error_set(error,0x12,0);
    srcza_local = (zip_t *)0x0;
  }
  else {
    error_local = (zip_error_t *)len;
    if (len == 0) {
      error_local = (zip_error_t *)0xffffffffffffffff;
    }
    if ((start == 0) && (error_local == (zip_error_t *)0xffffffffffffffff)) {
      start_local._4_4_ = flags | 4;
    }
    else {
      start_local._4_4_ = flags & 0xfffffffb;
    }
    srcza_local = (zip_t *)zip_source_zip_file_create
                                     (srcza,srcidx,start_local._4_4_,start,(zip_int64_t)error_local,
                                      (char *)0x0,error);
  }
  return (zip_source_t *)srcza_local;
}

Assistant:

ZIP_EXTERN zip_source_t *zip_source_zip_create(zip_t *srcza, zip_uint64_t srcidx, zip_flags_t flags, zip_uint64_t start, zip_int64_t len, zip_error_t *error) {
    if (len < -1) {
        zip_error_set(error, ZIP_ER_INVAL, 0);
        return NULL;
    }
    
    if (len == 0) {
        len = -1;
    }
    
    if (start == 0 && len == -1) {
        flags |= ZIP_FL_COMPRESSED;
    }
    else {
        flags &= ~ZIP_FL_COMPRESSED;
    }

    return zip_source_zip_file_create(srcza, srcidx, flags, start, len, NULL, error);
}